

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovDemuxer::mov_read_stsz(MovDemuxer *this,MOVAtom atom)

{
  Track *pTVar1;
  uint uVar2;
  uint local_34;
  ulong local_30;
  size_t i;
  Track *pTStack_20;
  uint entries;
  MOVStreamContext *st;
  MovDemuxer *this_local;
  
  pTStack_20 = (this->super_IOContextDemuxer).tracks[(this->super_IOContextDemuxer).num_tracks + -1]
  ;
  st = (MOVStreamContext *)this;
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  *(uint *)((long)&pTStack_20[1].encodingAlgoPriv.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8) = uVar2;
  i._4_4_ = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  if (*(int *)((long)&pTStack_20[1].encodingAlgoPriv.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8) == 0) {
    if (i._4_4_ < 0x3fffffff) {
      for (local_30 = 0; local_30 < i._4_4_; local_30 = local_30 + 1) {
        pTVar1 = pTStack_20 + 1;
        local_34 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pTVar1->stream_index,
                   &local_34);
      }
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MovDemuxer::mov_read_stsz(MOVAtom atom)
{
    const auto st = reinterpret_cast<MOVStreamContext*>(tracks[num_tracks - 1]);
    get_byte();  // version
    get_be24();  // flags
    st->sample_size = get_be32();
    const unsigned int entries = get_be32();
    if (st->sample_size)
        return 0;
    if (entries >= UINT_MAX / sizeof(int))
        return -1;
    for (size_t i = 0; i < entries; i++) st->m_index.push_back(get_be32());
    return 0;
}